

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfft_host.c
# Opt level: O1

void dfft_redistribute_block_to_cyclic_1d
               (int *dim,int *pdim,int ndim,int current_dim,int c0,int c1,int *pidx,int size_in,
               int *embed,cpx_t *work,cpx_t *scratch,int *dfft_nsend,int *dfft_nrecv,
               int *dfft_offset_send,int *dfft_offset_recv,MPI_Comm comm,int *proc_map,int row_m)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  cpx_t *pcVar7;
  int iVar8;
  long lVar9;
  cpx_t *pcVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  cpx_t *pcVar22;
  cpx_t *local_80;
  
  if (c0 != c1) {
    uVar11 = (long)dim[current_dim] / (long)pdim[current_dim] & 0xffffffff;
    iVar18 = embed[current_dim];
    iVar21 = (int)((long)dim[current_dim] / (long)pdim[current_dim]);
    uVar2 = (uint)((long)((ulong)(uint)(iVar21 >> 0x1f) << 0x20 | uVar11) / (long)(c1 / c0));
    uVar15 = 1;
    if ((int)uVar2 < 2) {
      uVar2 = 1;
    }
    uVar11 = (long)((ulong)(uint)(iVar21 >> 0x1f) << 0x20 | uVar11) / (long)(int)uVar2;
    iVar3 = (int)uVar11;
    uVar12 = (ulong)(uint)ndim;
    if (0 < ndim) {
      uVar6 = 0;
      do {
        uVar15 = uVar15 * pdim[uVar6];
        uVar6 = uVar6 + 1;
      } while (uVar12 != uVar6);
    }
    iVar1 = pidx[current_dim];
    if (0 < (int)uVar15) {
      uVar6 = 0;
      do {
        dfft_nsend[uVar6] = 0;
        dfft_nrecv[uVar6] = 0;
        dfft_offset_send[uVar6] = 0;
        dfft_offset_recv[uVar6] = 0;
        uVar6 = uVar6 + 1;
      } while (uVar15 != uVar6);
    }
    iVar17 = (int)((long)size_in / (long)iVar18);
    iVar4 = uVar2 * iVar17;
    uVar6 = (ulong)(uint)current_dim;
    if (0 < iVar3) {
      lVar19 = (long)iVar17;
      uVar16 = 0;
      local_80 = scratch;
      pcVar22 = work;
      do {
        iVar8 = (int)uVar16 * c0 + (iVar1 - iVar1 % c0) * iVar21 + iVar1 % c0;
        iVar8 = iVar8 % c1 + (iVar8 / (iVar21 * c1)) * c1;
        if (row_m == 0) {
          if (ndim < 1) goto LAB_00101f5d;
          uVar13 = 0;
          iVar5 = 0;
          do {
            iVar14 = iVar8;
            if (uVar6 != uVar13) {
              iVar14 = pidx[uVar13];
            }
            iVar5 = iVar5 * pdim[uVar13] + iVar14;
            uVar13 = uVar13 + 1;
          } while (uVar12 != uVar13);
        }
        else if (ndim < 1) {
LAB_00101f5d:
          iVar5 = 0;
        }
        else {
          iVar5 = 0;
          lVar9 = uVar12 + 1;
          do {
            iVar14 = iVar8;
            if (lVar9 - uVar6 != 2) {
              iVar14 = pidx[lVar9 + -2];
            }
            iVar5 = iVar5 * pdim[lVar9 + -2] + iVar14;
            lVar9 = lVar9 + -1;
          } while (1 < lVar9);
        }
        iVar8 = proc_map[iVar5];
        dfft_nsend[iVar8] = iVar4 * 8;
        dfft_offset_send[iVar8] = (int)uVar16 * iVar4 * 8;
        uVar13 = 0;
        pcVar7 = local_80;
        pcVar10 = pcVar22;
        do {
          if (0 < iVar17) {
            uVar20 = 0;
            do {
              pcVar7[uVar20] = pcVar10[uVar20];
              uVar20 = uVar20 + 1;
            } while (((long)size_in / (long)iVar18 & 0xffffffffU) != uVar20);
          }
          uVar13 = uVar13 + 1;
          pcVar10 = pcVar10 + (c1 / c0) * lVar19;
          pcVar7 = pcVar7 + lVar19;
        } while (uVar13 != uVar2);
        uVar16 = uVar16 + 1;
        pcVar22 = pcVar22 + lVar19;
        local_80 = local_80 + iVar4;
      } while (uVar16 != (uVar11 & 0xffffffff));
    }
    if (0 < iVar3) {
      iVar18 = 0;
      do {
        iVar8 = ((iVar18 * iVar4) / iVar17) * c1 + (iVar1 - iVar1 % c1) * iVar21 + iVar1 % c1;
        iVar8 = iVar8 % c0 + (iVar8 / (iVar21 * c0)) * c0;
        if (row_m == 0) {
          if (ndim < 1) goto LAB_001020d1;
          uVar11 = 0;
          iVar5 = 0;
          do {
            iVar14 = iVar8;
            if (uVar6 != uVar11) {
              iVar14 = pidx[uVar11];
            }
            iVar5 = iVar5 * pdim[uVar11] + iVar14;
            uVar11 = uVar11 + 1;
          } while (uVar12 != uVar11);
        }
        else if (ndim < 1) {
LAB_001020d1:
          iVar5 = 0;
        }
        else {
          iVar5 = 0;
          lVar19 = uVar12 + 1;
          do {
            iVar14 = iVar8;
            if (lVar19 - uVar6 != 2) {
              iVar14 = pidx[lVar19 + -2];
            }
            iVar5 = iVar5 * pdim[lVar19 + -2] + iVar14;
            lVar19 = lVar19 + -1;
          } while (1 < lVar19);
        }
        iVar8 = proc_map[iVar5];
        dfft_nrecv[iVar8] = iVar4 * 8;
        dfft_offset_recv[iVar8] = iVar18 * iVar4 * 8;
        iVar18 = iVar18 + 1;
      } while (iVar18 != iVar3);
    }
    MPI_Barrier(comm);
    MPI_Alltoallv(scratch,dfft_nsend,dfft_offset_send,&ompi_mpi_byte,work,dfft_nrecv,
                  dfft_offset_recv,&ompi_mpi_byte,comm);
  }
  return;
}

Assistant:

void dfft_redistribute_block_to_cyclic_1d(
                  int *dim,
                  int *pdim,
                  int ndim,
                  int current_dim,
                  int c0,
                  int c1,
                  int* pidx,
                  int size_in,
                  int *embed,
                  cpx_t *work,
                  cpx_t *scratch,
                  int *dfft_nsend,
                  int *dfft_nrecv,
                  int *dfft_offset_send,
                  int *dfft_offset_recv,
                  MPI_Comm comm,
                  int *proc_map,
                  int row_m)
    {
    /* exit early if nothing needs to be done */
    if (c0 == c1) return;

    int length = dim[current_dim]/pdim[current_dim];

    /* compute stride for column major matrix storage */
    int stride = size_in/embed[current_dim];

    /* processor index along current dimension */
    int s = pidx[current_dim];
    int p = pdim[current_dim];

    int ratio = c1/c0;
    int size = ((length/ratio > 1) ? (length/ratio) : 1);
    int npackets = length/size;
    size *= stride;

    int pdim_tot=1;
    int k;
    for (k = 0; k < ndim; ++k)
        pdim_tot *= pdim[k];

    int t;
    for (t = 0; t<pdim_tot; ++t)
        {
        dfft_nsend[t] = 0;
        dfft_nrecv[t] = 0;
        dfft_offset_send[t] = 0;
        dfft_offset_recv[t] = 0;
        }

    int j0;
    int j2;

    j0 = s % c0;
    j2 = s / c0;

    /* initialize send offsets and pack data */
    int j;
    #pragma omp parallel for private(j,k)
    for (j = 0; j < npackets; ++j)
        {
        int offset = j*size;
        int jglob = j2*c0*length + j * c0 + j0;
        int desti = (jglob/(c1*length))*c1+ jglob%c1;
        int destproc = 0;
        if (row_m)
            {
            for (k = ndim-1; k >=0 ;--k)
                {
                destproc *= pdim[k];
                destproc += ((current_dim == k) ? desti : pidx[k]);
                }
            }
        else
            {
            for (k = 0; k < ndim; ++k)
                {
                destproc *= pdim[k];
                destproc += ((current_dim == k) ? desti : pidx[k]);
                }
            }

        int rank = proc_map[destproc];
        dfft_nsend[rank] = size*sizeof(cpx_t);
        dfft_offset_send[rank] = offset*sizeof(cpx_t);
        int r;
        for(r=0; r< (size/stride); r++)
            for (k=0; k < stride; k++)
               scratch[offset + r*stride+k]=  work[(j+r*ratio)*stride+k];
        }

    /* initialize recv offsets */
    int offset = 0;
    j0 = s % c1;
    j2 = s/c1;

    int r;
    for (r = 0; r < npackets; ++r)
        {
        offset = r*size;
        j = r*size/stride;
        int jglob = j2*c1*length+ j * c1 + j0;
        int srci = (jglob/(c0*length))*c0+jglob%c0;
        int srcproc = 0;
        int k;
        if (row_m)
            {
            for (k = ndim-1; k >= 0; --k)
                {
                srcproc *= pdim[k];
                srcproc += ((current_dim == k) ? srci : pidx[k]);
                }
            }
        else
            {
            for (k = 0; k < ndim; ++k)
                {
                srcproc *= pdim[k];
                srcproc += ((current_dim == k) ? srci : pidx[k]);
                }
            }

        int rank = proc_map[srcproc];

        dfft_nrecv[rank] = size*sizeof(cpx_t);
        dfft_offset_recv[rank] = offset*sizeof(cpx_t);
        }

    /* synchronize */
    MPI_Barrier(comm);

    /* communicate */
    MPI_Alltoallv(scratch,dfft_nsend, dfft_offset_send, MPI_BYTE,
                  work, dfft_nrecv, dfft_offset_recv, MPI_BYTE,
                  comm);
    }